

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

Memory __thiscall
google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this,size_t *space_allocated)

{
  GetDeallocator deallocator;
  SerialArena *this_00;
  Memory mem_00;
  Memory MVar1;
  Memory mem;
  Memory local_38;
  GetDeallocator local_28;
  Memory *local_18;
  
  local_18 = &local_38;
  local_38.ptr = (void *)0x0;
  local_38.size = 0;
  if ((*(ulong *)(this + 8) & 0xfffffffffffffff8) == 0) {
    local_28.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    local_28.dealloc_ =
         *(_func_void_void_ptr_size_t **)((*(ulong *)(this + 8) & 0xfffffffffffffff8) + 0x18);
  }
  local_28.space_allocated_ = space_allocated;
  for (this_00 = *(SerialArena **)(this + 0x10); this_00 != (SerialArena *)0x0;
      this_00 = this_00->next_) {
    if (local_18->ptr != (void *)0x0) {
      mem_00.size = local_18->size;
      mem_00.ptr = local_18->ptr;
      GetDeallocator::operator()(&local_28,mem_00);
    }
    deallocator.space_allocated_ = local_28.space_allocated_;
    deallocator.dealloc_ = local_28.dealloc_;
    MVar1 = SerialArena::Free<google::protobuf::internal::GetDeallocator>(this_00,deallocator);
    *local_18 = MVar1;
  }
  MVar1.size = local_38.size;
  MVar1.ptr = local_38.ptr;
  return MVar1;
}

Assistant:

SerialArena::Memory ThreadSafeArena::Free(size_t* space_allocated) {
  SerialArena::Memory mem = {nullptr, 0};
  auto deallocator = GetDeallocator(alloc_policy_.get(), space_allocated);
  PerSerialArena([deallocator, &mem](SerialArena* a) {
    if (mem.ptr) deallocator(mem);
    mem = a->Free(deallocator);
  });
  return mem;
}